

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O1

void __thiscall DPolyAction::Serialize(DPolyAction *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  
  DObject::Serialize((DObject *)this,arc);
  pFVar1 = ::Serialize(arc,"polyobj",&this->m_PolyObj,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"speed",&this->m_Speed,(double *)0x0);
  pFVar1 = ::Serialize(pFVar1,"dist",&this->m_Dist,(double *)0x0);
  ::Serialize(pFVar1,"interpolation",(DObject **)&this->m_Interpolation,(DObject **)0x0,(bool *)0x0)
  ;
  return;
}

Assistant:

void DPolyAction::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	arc("polyobj", m_PolyObj)
		("speed", m_Speed)
		("dist", m_Dist)
		("interpolation", m_Interpolation);
}